

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

TryGetResult __thiscall capnp::SchemaLoader::Impl::tryGet(Impl *this,uint64_t typeId)

{
  size_t sVar1;
  Maybe<const_capnp::SchemaLoader::LazyLoadCallback_&> extraout_RDX;
  TryGetResult TVar2;
  long local_20;
  
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&local_20,(unsigned_long *)(typeId + 0x68));
  if (local_20 == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = *(size_t *)(local_20 + 8);
  }
  (this->arena).nextChunkSize = sVar1;
  (this->arena).chunkList = *(ChunkHeader **)(typeId + 0x198);
  TVar2.callback.ptr = extraout_RDX.ptr;
  TVar2.schema = (RawSchema *)this;
  return TVar2;
}

Assistant:

SchemaLoader::Impl::TryGetResult SchemaLoader::Impl::tryGet(uint64_t typeId) const {
  KJ_IF_SOME(schema, schemas.find(typeId)) {
    return {schema, initializer.getCallback()};
  } else {
    return {nullptr, initializer.getCallback()};
  }
}